

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPUState.cpp
# Opt level: O3

void __thiscall CPUState::setAccumulator(CPUState *this,uint16_t newValue,bool ignoreRegisterSize)

{
  undefined3 in_register_00000011;
  
  if ((CONCAT31(in_register_00000011,ignoreRegisterSize) == 0) &&
     ((this->m_FlagRegister & 0x20) != 0)) {
    newValue = CONCAT11(*(undefined1 *)((long)&this->m_Accumulator + 1),(char)newValue);
  }
  this->m_Accumulator = newValue;
  return;
}

Assistant:

void CPUState::setAccumulator(uint16_t newValue, bool ignoreRegisterSize) {
    if (ignoreRegisterSize) {
        m_Accumulator = newValue;
    } else {
        if (areFlagsSet(MEMORY_SELECT)) {
            //set only the lower byte of m_Accumulator
            m_Accumulator = (m_Accumulator & 0xFF00) + (newValue & 0x00FF);
        } else {
            m_Accumulator = newValue;
        }
    }
}